

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_entropy_coded_data(stbi__jpeg *z)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  short *data_00;
  short *data_3;
  int y2_1;
  int x2_1;
  int n_3;
  int y_1;
  int x_1;
  int k_1;
  int j_3;
  int i_3;
  int ha_2;
  short *data_2;
  int h_1;
  int w_1;
  int n_2;
  int j_2;
  int i_2;
  int ha_1;
  int y2;
  int x2;
  int n_1;
  short data_1 [64];
  int local_cc;
  int local_c8;
  int y;
  int x;
  int k;
  int j_1;
  int i_1;
  int ha;
  int h;
  int w;
  int n;
  short data [64];
  int local_20;
  int local_1c;
  int j;
  int i;
  stbi__jpeg *z_local;
  
  stbi__jpeg_reset(z);
  if (z->progressive == 0) {
    if (z->scan_n == 1) {
      iVar3 = z->order[0];
      iVar4 = z->img_comp[iVar3].x;
      iVar1 = z->img_comp[iVar3].y;
      for (local_20 = 0; local_20 < iVar1 + 7 >> 3; local_20 = local_20 + 1) {
        for (local_1c = 0; local_1c < iVar4 + 7 >> 3; local_1c = local_1c + 1) {
          iVar2 = z->img_comp[iVar3].ha;
          iVar2 = stbi__jpeg_decode_block
                            (z,(short *)&w,z->huff_dc + z->img_comp[iVar3].hd,z->huff_ac + iVar2,
                             z->fast_ac[iVar2],iVar3,z->dequant[z->img_comp[iVar3].tq]);
          if (iVar2 == 0) {
            return 0;
          }
          (*z->idct_block_kernel)
                    (z->img_comp[iVar3].data +
                     (long)(local_1c << 3) + (long)(z->img_comp[iVar3].w2 * local_20 * 8),
                     z->img_comp[iVar3].w2,(short *)&w);
          iVar2 = z->todo + -1;
          z->todo = iVar2;
          if (iVar2 < 1) {
            if (z->code_bits < 0x18) {
              stbi__grow_buffer_unsafe(z);
            }
            if ((z->marker < 0xd0) || (0xd7 < z->marker)) {
              return 1;
            }
            stbi__jpeg_reset(z);
          }
        }
      }
    }
    else {
      for (x = 0; x < z->img_mcu_y; x = x + 1) {
        for (k = 0; k < z->img_mcu_x; k = k + 1) {
          for (y = 0; y < z->scan_n; y = y + 1) {
            iVar3 = z->order[y];
            for (local_cc = 0; local_cc < z->img_comp[iVar3].v; local_cc = local_cc + 1) {
              for (local_c8 = 0; local_c8 < z->img_comp[iVar3].h; local_c8 = local_c8 + 1) {
                iVar4 = z->img_comp[iVar3].h;
                iVar1 = z->img_comp[iVar3].v;
                iVar2 = z->img_comp[iVar3].ha;
                iVar2 = stbi__jpeg_decode_block
                                  (z,(short *)&x2,z->huff_dc + z->img_comp[iVar3].hd,
                                   z->huff_ac + iVar2,z->fast_ac[iVar2],iVar3,
                                   z->dequant[z->img_comp[iVar3].tq]);
                if (iVar2 == 0) {
                  return 0;
                }
                (*z->idct_block_kernel)
                          (z->img_comp[iVar3].data +
                           (long)((k * iVar4 + local_c8) * 8) +
                           (long)(z->img_comp[iVar3].w2 * (x * iVar1 + local_cc) * 8),
                           z->img_comp[iVar3].w2,(short *)&x2);
              }
            }
          }
          iVar3 = z->todo + -1;
          z->todo = iVar3;
          if (iVar3 < 1) {
            if (z->code_bits < 0x18) {
              stbi__grow_buffer_unsafe(z);
            }
            if ((z->marker < 0xd0) || (0xd7 < z->marker)) {
              return 1;
            }
            stbi__jpeg_reset(z);
          }
        }
      }
    }
  }
  else if (z->scan_n == 1) {
    iVar3 = z->order[0];
    iVar4 = z->img_comp[iVar3].x;
    iVar1 = z->img_comp[iVar3].y;
    for (w_1 = 0; w_1 < iVar1 + 7 >> 3; w_1 = w_1 + 1) {
      for (n_2 = 0; n_2 < iVar4 + 7 >> 3; n_2 = n_2 + 1) {
        data_00 = z->img_comp[iVar3].coeff + (n_2 + w_1 * z->img_comp[iVar3].coeff_w) * 0x40;
        if (z->spec_start == 0) {
          iVar2 = stbi__jpeg_decode_block_prog_dc
                            (z,data_00,z->huff_dc + z->img_comp[iVar3].hd,iVar3);
          if (iVar2 == 0) {
            return 0;
          }
        }
        else {
          iVar2 = z->img_comp[iVar3].ha;
          iVar2 = stbi__jpeg_decode_block_prog_ac(z,data_00,z->huff_ac + iVar2,z->fast_ac[iVar2]);
          if (iVar2 == 0) {
            return 0;
          }
        }
        iVar2 = z->todo + -1;
        z->todo = iVar2;
        if (iVar2 < 1) {
          if (z->code_bits < 0x18) {
            stbi__grow_buffer_unsafe(z);
          }
          if ((z->marker < 0xd0) || (0xd7 < z->marker)) {
            return 1;
          }
          stbi__jpeg_reset(z);
        }
      }
    }
  }
  else {
    for (x_1 = 0; x_1 < z->img_mcu_y; x_1 = x_1 + 1) {
      for (k_1 = 0; k_1 < z->img_mcu_x; k_1 = k_1 + 1) {
        for (y_1 = 0; y_1 < z->scan_n; y_1 = y_1 + 1) {
          iVar3 = z->order[y_1];
          for (x2_1 = 0; x2_1 < z->img_comp[iVar3].v; x2_1 = x2_1 + 1) {
            for (n_3 = 0; n_3 < z->img_comp[iVar3].h; n_3 = n_3 + 1) {
              iVar4 = stbi__jpeg_decode_block_prog_dc
                                (z,z->img_comp[iVar3].coeff +
                                   (k_1 * z->img_comp[iVar3].h + n_3 +
                                   (x_1 * z->img_comp[iVar3].v + x2_1) * z->img_comp[iVar3].coeff_w)
                                   * 0x40,z->huff_dc + z->img_comp[iVar3].hd,iVar3);
              if (iVar4 == 0) {
                return 0;
              }
            }
          }
        }
        iVar3 = z->todo + -1;
        z->todo = iVar3;
        if (iVar3 < 1) {
          if (z->code_bits < 0x18) {
            stbi__grow_buffer_unsafe(z);
          }
          if ((z->marker < 0xd0) || (0xd7 < z->marker)) {
            return 1;
          }
          stbi__jpeg_reset(z);
        }
      }
    }
  }
  return 1;
}

Assistant:

static int stbi__parse_entropy_coded_data(stbi__jpeg *z)
{
    stbi__jpeg_reset(z);
    if (!z->progressive)
    {
        if (z->scan_n == 1)
        {
            int i, j;
            STBI_SIMD_ALIGN(short, data[64]);
            int n = z->order[0];
            // non-interleaved data, we just need to process one block at a time,
            // in trivial scanline order
            // number of blocks to do just depends on how many actual "pixels" this
            // component has, independent of interleaved MCU blocking and such
            int w = (z->img_comp[n].x + 7) >> 3;
            int h = (z->img_comp[n].y + 7) >> 3;
            for (j = 0; j < h; ++j)
            {
                for (i = 0; i < w; ++i)
                {
                    int ha = z->img_comp[n].ha;
                    if (!stbi__jpeg_decode_block(z, data, z->huff_dc + z->img_comp[n].hd, z->huff_ac + ha,
                                                 z->fast_ac[ha], n, z->dequant[z->img_comp[n].tq]))
                        return 0;
                    z->idct_block_kernel(z->img_comp[n].data + z->img_comp[n].w2 * j * 8 + i * 8, z->img_comp[n].w2,
                                         data);
                    // every data block is an MCU, so countdown the restart interval
                    if (--z->todo <= 0)
                    {
                        if (z->code_bits < 24) stbi__grow_buffer_unsafe(z);
                        // if it's NOT a restart, then just bail, so we get corrupt data
                        // rather than no data
                        if (!STBI__RESTART(z->marker)) return 1;
                        stbi__jpeg_reset(z);
                    }
                }
            }
            return 1;
        } else
        { // interleaved
            int i, j, k, x, y;
            STBI_SIMD_ALIGN(short, data[64]);
            for (j = 0; j < z->img_mcu_y; ++j)
            {
                for (i = 0; i < z->img_mcu_x; ++i)
                {
                    // scan an interleaved mcu... process scan_n components in order
                    for (k = 0; k < z->scan_n; ++k)
                    {
                        int n = z->order[k];
                        // scan out an mcu's worth of this component; that's just determined
                        // by the basic H and V specified for the component
                        for (y = 0; y < z->img_comp[n].v; ++y)
                        {
                            for (x = 0; x < z->img_comp[n].h; ++x)
                            {
                                int x2 = (i * z->img_comp[n].h + x) * 8;
                                int y2 = (j * z->img_comp[n].v + y) * 8;
                                int ha = z->img_comp[n].ha;
                                if (!stbi__jpeg_decode_block(z, data, z->huff_dc + z->img_comp[n].hd, z->huff_ac + ha,
                                                             z->fast_ac[ha], n, z->dequant[z->img_comp[n].tq]))
                                    return 0;
                                z->idct_block_kernel(z->img_comp[n].data + z->img_comp[n].w2 * y2 + x2,
                                                     z->img_comp[n].w2, data);
                            }
                        }
                    }
                    // after all interleaved components, that's an interleaved MCU,
                    // so now count down the restart interval
                    if (--z->todo <= 0)
                    {
                        if (z->code_bits < 24) stbi__grow_buffer_unsafe(z);
                        if (!STBI__RESTART(z->marker)) return 1;
                        stbi__jpeg_reset(z);
                    }
                }
            }
            return 1;
        }
    } else
    {
        if (z->scan_n == 1)
        {
            int i, j;
            int n = z->order[0];
            // non-interleaved data, we just need to process one block at a time,
            // in trivial scanline order
            // number of blocks to do just depends on how many actual "pixels" this
            // component has, independent of interleaved MCU blocking and such
            int w = (z->img_comp[n].x + 7) >> 3;
            int h = (z->img_comp[n].y + 7) >> 3;
            for (j = 0; j < h; ++j)
            {
                for (i = 0; i < w; ++i)
                {
                    short *data = z->img_comp[n].coeff + 64 * (i + j * z->img_comp[n].coeff_w);
                    if (z->spec_start == 0)
                    {
                        if (!stbi__jpeg_decode_block_prog_dc(z, data, &z->huff_dc[z->img_comp[n].hd], n))
                            return 0;
                    } else
                    {
                        int ha = z->img_comp[n].ha;
                        if (!stbi__jpeg_decode_block_prog_ac(z, data, &z->huff_ac[ha], z->fast_ac[ha]))
                            return 0;
                    }
                    // every data block is an MCU, so countdown the restart interval
                    if (--z->todo <= 0)
                    {
                        if (z->code_bits < 24) stbi__grow_buffer_unsafe(z);
                        if (!STBI__RESTART(z->marker)) return 1;
                        stbi__jpeg_reset(z);
                    }
                }
            }
            return 1;
        } else
        { // interleaved
            int i, j, k, x, y;
            for (j = 0; j < z->img_mcu_y; ++j)
            {
                for (i = 0; i < z->img_mcu_x; ++i)
                {
                    // scan an interleaved mcu... process scan_n components in order
                    for (k = 0; k < z->scan_n; ++k)
                    {
                        int n = z->order[k];
                        // scan out an mcu's worth of this component; that's just determined
                        // by the basic H and V specified for the component
                        for (y = 0; y < z->img_comp[n].v; ++y)
                        {
                            for (x = 0; x < z->img_comp[n].h; ++x)
                            {
                                int x2 = (i * z->img_comp[n].h + x);
                                int y2 = (j * z->img_comp[n].v + y);
                                short *data = z->img_comp[n].coeff + 64 * (x2 + y2 * z->img_comp[n].coeff_w);
                                if (!stbi__jpeg_decode_block_prog_dc(z, data, &z->huff_dc[z->img_comp[n].hd], n))
                                    return 0;
                            }
                        }
                    }
                    // after all interleaved components, that's an interleaved MCU,
                    // so now count down the restart interval
                    if (--z->todo <= 0)
                    {
                        if (z->code_bits < 24) stbi__grow_buffer_unsafe(z);
                        if (!STBI__RESTART(z->marker)) return 1;
                        stbi__jpeg_reset(z);
                    }
                }
            }
            return 1;
        }
    }
}